

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaInfo.hpp
# Opt level: O1

void __thiscall
xercesc_4_0::SchemaInfo::addSchemaInfo(SchemaInfo *this,SchemaInfo *toAdd,ListType aListType)

{
  MemoryManager *pMVar1;
  BaseRefVectorOf<xercesc_4_0::SchemaInfo> *pBVar2;
  ulong uVar3;
  XMLSize_t XVar4;
  SchemaInfo **ppSVar5;
  XMLSize_t XVar6;
  ulong uVar7;
  int iVar8;
  XMLSize_t index;
  RefVectorOf<xercesc_4_0::SchemaInfo> *pRVar9;
  undefined4 extraout_var;
  long lVar10;
  undefined4 extraout_var_00;
  SchemaInfo *pSVar11;
  ulong uVar12;
  XMLSize_t XVar13;
  bool bVar14;
  
  if (aListType == IMPORT) {
    if (this->fImportedInfoList == (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
      pRVar9 = (RefVectorOf<xercesc_4_0::SchemaInfo> *)
               XMemory::operator_new(0x30,this->fMemoryManager);
      pMVar1 = this->fMemoryManager;
      (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>)._vptr_BaseRefVectorOf =
           (_func_int **)&PTR__BaseRefVectorOf_0041c1c8;
      (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fAdoptedElems = false;
      (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount = 0;
      (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fMaxCount = 4;
      (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fElemList = (SchemaInfo **)0x0;
      (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fMemoryManager = pMVar1;
      iVar8 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0x20);
      (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fElemList =
           (SchemaInfo **)CONCAT44(extraout_var,iVar8);
      lVar10 = 0;
      do {
        (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fElemList[lVar10] =
             (SchemaInfo *)0x0;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>)._vptr_BaseRefVectorOf =
           (_func_int **)&PTR__RefVectorOf_0041c150;
      this->fImportedInfoList = pRVar9;
    }
    pBVar2 = &this->fImportedInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
    uVar3 = pBVar2->fCurCount;
    bVar14 = uVar3 != 0;
    if (bVar14) {
      if (*pBVar2->fElemList == toAdd) {
        return;
      }
      uVar7 = 1;
      do {
        uVar12 = uVar7;
        if (uVar3 == uVar12) break;
        uVar7 = uVar12 + 1;
      } while (pBVar2->fElemList[uVar12] != toAdd);
      bVar14 = uVar12 < uVar3;
    }
    if (!bVar14) {
      BaseRefVectorOf<xercesc_4_0::SchemaInfo>::ensureExtraCapacity(pBVar2,1);
      XVar4 = pBVar2->fCurCount;
      pBVar2->fElemList[XVar4] = toAdd;
      pBVar2->fCurCount = XVar4 + 1;
      updateImportingInfo(toAdd,this);
      return;
    }
  }
  else {
    if (this->fIncludeInfoList == (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
      pRVar9 = (RefVectorOf<xercesc_4_0::SchemaInfo> *)
               XMemory::operator_new(0x30,this->fMemoryManager);
      pMVar1 = this->fMemoryManager;
      (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>)._vptr_BaseRefVectorOf =
           (_func_int **)&PTR__BaseRefVectorOf_0041c1c8;
      (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fAdoptedElems = false;
      (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount = 0;
      (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fMaxCount = 8;
      (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fElemList = (SchemaInfo **)0x0;
      (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fMemoryManager = pMVar1;
      iVar8 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0x40);
      (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fElemList =
           (SchemaInfo **)CONCAT44(extraout_var_00,iVar8);
      lVar10 = 0;
      do {
        (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fElemList[lVar10] =
             (SchemaInfo *)0x0;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 8);
      (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>)._vptr_BaseRefVectorOf =
           (_func_int **)&PTR__RefVectorOf_0041c150;
      this->fIncludeInfoList = pRVar9;
      this->fAdoptInclude = true;
    }
    pBVar2 = &this->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
    uVar3 = pBVar2->fCurCount;
    bVar14 = uVar3 != 0;
    if (bVar14) {
      if (*pBVar2->fElemList == toAdd) {
        return;
      }
      uVar7 = 1;
      do {
        uVar12 = uVar7;
        if (uVar3 == uVar12) break;
        uVar7 = uVar12 + 1;
      } while (pBVar2->fElemList[uVar12] != toAdd);
      bVar14 = uVar12 < uVar3;
    }
    if (!bVar14) {
      BaseRefVectorOf<xercesc_4_0::SchemaInfo>::ensureExtraCapacity(pBVar2,1);
      XVar4 = pBVar2->fCurCount;
      pBVar2->fElemList[XVar4] = toAdd;
      pBVar2->fCurCount = XVar4 + 1;
      pRVar9 = toAdd->fIncludeInfoList;
      if (pRVar9 == (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
        toAdd->fIncludeInfoList = this->fIncludeInfoList;
      }
      else if (pRVar9 != this->fIncludeInfoList) {
        XVar4 = (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount;
        if (XVar4 != 0) {
          XVar13 = 0;
          do {
            pRVar9 = this->fIncludeInfoList;
            pSVar11 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                                (&toAdd->fIncludeInfoList->
                                  super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,XVar13);
            uVar3 = (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount;
            bVar14 = uVar3 != 0;
            if (uVar3 == 0) {
LAB_0033f905:
              if (!bVar14) {
                pBVar2 = &this->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
                pSVar11 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                                    (&toAdd->fIncludeInfoList->
                                      super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,XVar13);
                BaseRefVectorOf<xercesc_4_0::SchemaInfo>::ensureExtraCapacity(pBVar2,1);
                XVar6 = pBVar2->fCurCount;
                pBVar2->fElemList[XVar6] = pSVar11;
                pBVar2->fCurCount = XVar6 + 1;
              }
            }
            else {
              ppSVar5 = (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fElemList;
              if (*ppSVar5 != pSVar11) {
                uVar7 = 1;
                do {
                  uVar12 = uVar7;
                  if (uVar3 == uVar12) break;
                  uVar7 = uVar12 + 1;
                } while (ppSVar5[uVar12] != pSVar11);
                bVar14 = uVar12 < uVar3;
                goto LAB_0033f905;
              }
            }
            XVar13 = XVar13 + 1;
          } while (XVar13 != XVar4);
        }
        XVar4 = (this->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount;
        if (XVar4 != 0) {
          XVar13 = 0;
          do {
            pRVar9 = toAdd->fIncludeInfoList;
            pSVar11 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                                (&this->fIncludeInfoList->
                                  super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,XVar13);
            uVar3 = (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount;
            bVar14 = uVar3 != 0;
            if (uVar3 == 0) {
LAB_0033f9a3:
              if (!bVar14) {
                pBVar2 = &toAdd->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
                pSVar11 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                                    (&this->fIncludeInfoList->
                                      super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,XVar13);
                BaseRefVectorOf<xercesc_4_0::SchemaInfo>::ensureExtraCapacity(pBVar2,1);
                XVar6 = pBVar2->fCurCount;
                pBVar2->fElemList[XVar6] = pSVar11;
                pBVar2->fCurCount = XVar6 + 1;
              }
            }
            else {
              ppSVar5 = (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fElemList;
              if (*ppSVar5 != pSVar11) {
                uVar7 = 1;
                do {
                  uVar12 = uVar7;
                  if (uVar3 == uVar12) break;
                  uVar7 = uVar12 + 1;
                } while (ppSVar5[uVar12] != pSVar11);
                bVar14 = uVar12 < uVar3;
                goto LAB_0033f9a3;
              }
            }
            XVar13 = XVar13 + 1;
          } while (XVar13 != XVar4);
        }
      }
    }
  }
  return;
}

Assistant:

inline void SchemaInfo::addSchemaInfo(SchemaInfo* const toAdd,
                                      const ListType aListType) {

    if (aListType == IMPORT) {

        if (!fImportedInfoList)
            fImportedInfoList = new (fMemoryManager) RefVectorOf<SchemaInfo>(4, false, fMemoryManager);

        if (!fImportedInfoList->containsElement(toAdd)) {

            fImportedInfoList->addElement(toAdd);
            toAdd->updateImportingInfo(this);
        }
    }
    else {

        if (!fIncludeInfoList) {

            fIncludeInfoList = new (fMemoryManager) RefVectorOf<SchemaInfo>(8, false, fMemoryManager);
            fAdoptInclude = true;
        }

        if (!fIncludeInfoList->containsElement(toAdd)) {

		    fIncludeInfoList->addElement(toAdd);
            //code was originally:
            //toAdd->fIncludeInfoList = fIncludeInfoList;
            //however for handling multiple imports this was causing
            //to schemaInfo's to have the same fIncludeInfoList which they
            //both owned so when it was deleted it crashed.
			if (toAdd->fIncludeInfoList) {
			   if (toAdd->fIncludeInfoList != fIncludeInfoList) {
                   XMLSize_t size = toAdd->fIncludeInfoList->size();
                   for (XMLSize_t i=0; i<size; i++) {
                       if (!fIncludeInfoList->containsElement(toAdd->fIncludeInfoList->elementAt(i))) {
                            fIncludeInfoList->addElement(toAdd->fIncludeInfoList->elementAt(i));
                       }
                   }
                   size = fIncludeInfoList->size();
                   for (XMLSize_t j=0; j<size; j++) {
                       if (!toAdd->fIncludeInfoList->containsElement(fIncludeInfoList->elementAt(j))) {
                            toAdd->fIncludeInfoList->addElement(fIncludeInfoList->elementAt(j));
                       }
                   }
			   }
			}
			else {
				toAdd->fIncludeInfoList = fIncludeInfoList;
			}
        }
    }
}